

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkPredict_MaximumOrder(ARKodeMem ark_mem,sunrealtype tau,N_Vector yguess)

{
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  N_Vector in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xbe8,"arkPredict_MaximumOrder",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"ARKodeMem structure is NULL");
    iVar1 = -0x15;
  }
  else if (in_RDI->interp == (ARKInterp)0x0) {
    arkProcessError(in_RDI,-0x15,0xbee,"arkPredict_MaximumOrder",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                    ,"ARKodeInterpMem structure is NULL");
    iVar1 = -0x15;
  }
  else {
    iVar1 = arkInterpEvaluate((ARKodeMem_conflict)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (ARKInterp)in_RDI,in_XMM0_Qa,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                              in_stack_ffffffffffffffd8);
  }
  return iVar1;
}

Assistant:

int arkPredict_MaximumOrder(ARKodeMem ark_mem, sunrealtype tau, N_Vector yguess)
{
  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeMem structure is NULL");
    return (ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeInterpMem structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* call the interpolation module to do the work */
  return (arkInterpEvaluate(ark_mem, ark_mem->interp, tau, 0,
                            ARK_INTERP_MAX_DEGREE, yguess));
}